

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

Vector2i __thiscall sf::priv::WindowImplX11::getPosition(WindowImplX11 *this)

{
  bool bVar1;
  int iVar2;
  Atom AVar3;
  Window WVar4;
  Window win;
  ulong uVar5;
  ulong uVar6;
  Display *pDVar7;
  String *left;
  uint *puVar8;
  uint *puVar9;
  Display *pDVar10;
  bool bVar11;
  int yAbsRelToRoot;
  int xAbsRelToRoot;
  uint height;
  int xRelToRoot;
  Window root;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  uint width;
  int yRelToRoot;
  undefined4 uStack_44;
  uint depth;
  uint borderWidth;
  Window child;
  
  pDVar7 = this->m_display;
  XTranslateCoordinates
            (pDVar7,this->m_window,
             *(undefined8 *)(*(long *)(pDVar7 + 0xe8) + 0x10 + (long)*(int *)(pDVar7 + 0xe0) * 0x80)
             ,0,0,&xAbsRelToRoot,&yAbsRelToRoot,&child);
  bVar1 = anon_unknown.dwarf_3fa351::WindowsImplX11Impl::ewmhSupported();
  if (bVar1) {
    bVar1 = sf::operator==((String *)(anonymous_namespace)::WindowsImplX11Impl::wmAbsPosGood,
                           (String *)(anonymous_namespace)::WindowsImplX11Impl::windowManagerName);
    if (!bVar1) {
      left = (String *)((anonymous_namespace)::WindowsImplX11Impl::wmAbsPosGood + 0x20);
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (uVar5 == 2) break;
        bVar1 = sf::operator==(left,(String *)
                                    (anonymous_namespace)::WindowsImplX11Impl::windowManagerName);
        left = left + 1;
        uVar6 = uVar5 + 1;
      } while (!bVar1);
      if (1 < uVar5) goto LAB_001ebf14;
    }
    uVar6 = (ulong)(uint)yAbsRelToRoot;
    goto LAB_001ec10a;
  }
LAB_001ebf14:
  puVar9 = (uint *)this->m_window;
  pDVar7 = this->m_display;
  bVar1 = anon_unknown.dwarf_3fa351::WindowsImplX11Impl::ewmhSupported();
  if (bVar1) {
    root = (Window)&local_60;
    _xRelToRoot = 0x12;
    root = std::__cxx11::string::_M_create((ulong *)&root,(ulong)&xRelToRoot);
    local_60._M_allocated_capacity = _xRelToRoot;
    builtin_strncpy((char *)root,"_NET_FRAME_EXTENTS",0x12);
    local_68 = _xRelToRoot;
    *(char *)(root + _xRelToRoot) = '\0';
    AVar3 = getAtom((string *)&root,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)root != &local_60) {
      operator_delete((void *)root);
    }
    if (AVar3 == 0) goto LAB_001ec048;
    puVar8 = &width;
    _width = (uint *)0x0;
    pDVar10 = (Display *)&yRelToRoot;
    iVar2 = XGetWindowProperty(pDVar7,puVar9,AVar3,0,4,0,6,(string *)&root,&height,&xRelToRoot,
                               pDVar10,puVar8);
    bVar11 = CONCAT44(uStack_44,yRelToRoot) == 0;
    bVar1 = (_width != (uint *)0x0 && (bVar11 && _xRelToRoot == 4)) &&
            ((height == 0x20 && root == 6) && iVar2 == 0);
    if ((_width != (uint *)0x0 && (bVar11 && _xRelToRoot == 4)) &&
        ((height == 0x20 && root == 6) && iVar2 == 0)) {
      puVar8 = (uint *)(ulong)*_width;
      pDVar10 = (Display *)(ulong)_width[4];
    }
    puVar9 = puVar8;
    pDVar7 = pDVar10;
    if (_width != (uint *)0x0) {
      XFree();
    }
  }
  else {
LAB_001ec048:
    bVar1 = false;
  }
  if (bVar1) {
    xAbsRelToRoot = xAbsRelToRoot - (int)puVar9;
    uVar6 = (ulong)(uint)(yAbsRelToRoot - (int)pDVar7);
  }
  else {
    win = this->m_window;
    root = *(Window *)
            (*(long *)(this->m_display + 0xe8) + 0x10 +
            (long)*(int *)(this->m_display + 0xe0) * 0x80);
    pDVar7 = this->m_display;
    while( true ) {
      WVar4 = anon_unknown.dwarf_3fa351::WindowsImplX11Impl::getParentWindow(pDVar7,win);
      if (WVar4 == root) break;
      win = anon_unknown.dwarf_3fa351::WindowsImplX11Impl::getParentWindow(this->m_display,win);
      pDVar7 = this->m_display;
    }
    XGetGeometry(this->m_display,win,&root,&xRelToRoot,&yRelToRoot,&width,&height,&borderWidth,
                 &depth);
    uVar6 = (ulong)(uint)yRelToRoot;
    xAbsRelToRoot = xRelToRoot;
  }
LAB_001ec10a:
  return (Vector2i)((ulong)(uint)xAbsRelToRoot | uVar6 << 0x20);
}

Assistant:

Vector2i WindowImplX11::getPosition() const
{
    using namespace WindowsImplX11Impl;

    // Get absolute position of our window relative to root window. This
    // takes into account all information that X11 has, including X11
    // border widths and any decorations. It corresponds to where the
    // window actually is, but not necessarily to where we told it to
    // go using setPosition() and XMoveWindow(). To have the two match
    // as expected, we may have to subtract decorations and borders.
    ::Window child;
    int xAbsRelToRoot, yAbsRelToRoot;

    XTranslateCoordinates(m_display, m_window, DefaultRootWindow(m_display),
        0, 0, &xAbsRelToRoot, &yAbsRelToRoot, &child);

    // CASE 1: some rare WMs actually put the window exactly where we tell
    // it to, even with decorations and such, which get shifted back.
    // In these rare cases, we can use the absolute value directly.
    if (isWMAbsolutePositionGood())
        return Vector2i(xAbsRelToRoot, yAbsRelToRoot);

    // CASE 2: most modern WMs support EWMH and can define _NET_FRAME_EXTENTS
    // with the exact frame size to subtract, so if present, we prefer it and
    // query it first. According to spec, this already includes any borders.
    long xFrameExtent, yFrameExtent;

    if (getEWMHFrameExtents(m_display, m_window, xFrameExtent, yFrameExtent))
    {
        // Get final X/Y coordinates: subtract EWMH frame extents from
        // absolute window position.
        return Vector2i((xAbsRelToRoot - static_cast<int>(xFrameExtent)), (yAbsRelToRoot - static_cast<int>(yFrameExtent)));
    }

    // CASE 3: EWMH frame extents were not available, use geometry.
    // We climb back up to the window before the root and use its
    // geometry information to extract X/Y position. This because
    // re-parenting WMs may re-parent the window multiple times, so
    // we'd have to climb up to the furthest ancestor and sum the
    // relative differences and borders anyway; and doing that to
    // subtract those values from the absolute coordinates of the
    // window is equivalent to going up the tree and asking the
    // furthest ancestor what it's relative distance to the root is.
    // So we use that approach because it's simpler.
    // This approach assumes that any window between the root and
    // our window is part of decorations/borders in some way. This
    // seems to hold true for most reasonable WM implementations.
    ::Window ancestor = m_window;
    ::Window root = DefaultRootWindow(m_display);

    while (getParentWindow(m_display, ancestor) != root)
    {
        // Next window up (parent window).
        ancestor = getParentWindow(m_display, ancestor);
    }

    // Get final X/Y coordinates: take the relative position to
    // the root of the furthest ancestor window.
    int xRelToRoot, yRelToRoot;
    unsigned int width, height, borderWidth, depth;

    XGetGeometry(m_display, ancestor, &root, &xRelToRoot, &yRelToRoot,
        &width, &height, &borderWidth, &depth);

    return Vector2i(xRelToRoot, yRelToRoot);
}